

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertRGBToY_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *Y)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 (*in_RCX) [16];
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i V0_hi;
  __m128i V0_lo;
  __m128i GB_hi;
  __m128i GB_lo;
  __m128i RG_hi;
  __m128i RG_lo;
  __m128i kHALF_Y;
  __m128i kGB_y;
  __m128i kRG_y;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i V5_hi;
  __m128i V5_lo;
  __m128i V3_hi;
  __m128i V3_lo;
  __m128i V2_hi;
  __m128i V2_lo;
  __m128i V1_hi;
  __m128i V1_lo;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RSI;
  local_1e8 = (undefined2)uVar1;
  uStack_1e6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1e4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1e2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1f8 = (undefined2)uVar2;
  uStack_1f6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1f4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1f2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[1];
  uVar2 = in_RSI[1];
  uStack_1a0 = (undefined2)uVar1;
  uStack_19e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_19c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_19a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1b0 = (undefined2)uVar2;
  uStack_1ae = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1ac = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1aa = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *in_RSI;
  uVar2 = *in_RDX;
  local_208 = (undefined2)uVar1;
  uStack_206 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_204 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_202 = (undefined2)((ulong)uVar1 >> 0x30);
  local_218 = (undefined2)uVar2;
  uStack_216 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_214 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_212 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RSI[1];
  uVar2 = in_RDX[1];
  uStack_1c0 = (undefined2)uVar1;
  uStack_1be = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1bc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1ba = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_1d0 = (undefined2)uVar2;
  uStack_1ce = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1cc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1ca = (undefined2)((ulong)uVar2 >> 0x30);
  auVar5._2_2_ = local_1f8;
  auVar5._0_2_ = local_1e8;
  auVar5._4_2_ = uStack_1e6;
  auVar5._6_2_ = uStack_1f6;
  auVar5._10_2_ = uStack_1f4;
  auVar5._8_2_ = uStack_1e4;
  auVar5._12_2_ = uStack_1e2;
  auVar5._14_2_ = uStack_1f2;
  auVar8._8_8_ = 0x412341c7412341c7;
  auVar8._0_8_ = 0x412341c7412341c7;
  auVar8 = pmaddwd(auVar5,auVar8);
  auVar4._2_2_ = uStack_1b0;
  auVar4._0_2_ = uStack_1a0;
  auVar4._4_2_ = uStack_19e;
  auVar4._6_2_ = uStack_1ae;
  auVar4._10_2_ = uStack_1ac;
  auVar4._8_2_ = uStack_19c;
  auVar4._12_2_ = uStack_19a;
  auVar4._14_2_ = uStack_1aa;
  auVar9._8_8_ = 0x412341c7412341c7;
  auVar9._0_8_ = 0x412341c7412341c7;
  auVar9 = pmaddwd(auVar4,auVar9);
  auVar3._2_2_ = local_218;
  auVar3._0_2_ = local_208;
  auVar3._4_2_ = uStack_206;
  auVar3._6_2_ = uStack_216;
  auVar3._10_2_ = uStack_214;
  auVar3._8_2_ = uStack_204;
  auVar3._12_2_ = uStack_202;
  auVar3._14_2_ = uStack_212;
  auVar10._8_8_ = 0x1914400019144000;
  auVar10._0_8_ = 0x1914400019144000;
  auVar10 = pmaddwd(auVar3,auVar10);
  auVar12._2_2_ = uStack_1d0;
  auVar12._0_2_ = uStack_1c0;
  auVar12._4_2_ = uStack_1be;
  auVar12._6_2_ = uStack_1ce;
  auVar12._10_2_ = uStack_1cc;
  auVar12._8_2_ = uStack_1bc;
  auVar12._12_2_ = uStack_1ba;
  auVar12._14_2_ = uStack_1ca;
  auVar11._8_8_ = 0x1914400019144000;
  auVar11._0_8_ = 0x1914400019144000;
  auVar11 = pmaddwd(auVar12,auVar11);
  local_98 = auVar8._0_4_;
  iStack_94 = auVar8._4_4_;
  iStack_90 = auVar8._8_4_;
  iStack_8c = auVar8._12_4_;
  local_a8 = auVar10._0_4_;
  iStack_a4 = auVar10._4_4_;
  iStack_a0 = auVar10._8_4_;
  iStack_9c = auVar10._12_4_;
  local_b8 = auVar9._0_4_;
  iStack_b4 = auVar9._4_4_;
  iStack_b0 = auVar9._8_4_;
  iStack_ac = auVar9._12_4_;
  local_c8 = auVar11._0_4_;
  iStack_c4 = auVar11._4_4_;
  iStack_c0 = auVar11._8_4_;
  iStack_bc = auVar11._12_4_;
  auVar11 = ZEXT416(0x10);
  auVar12 = ZEXT416(0x10);
  auVar7._4_4_ = iStack_94 + iStack_a4 + 0x108000 >> auVar11;
  auVar7._0_4_ = local_98 + local_a8 + 0x108000 >> auVar11;
  auVar7._12_4_ = iStack_8c + iStack_9c + 0x108000 >> auVar11;
  auVar7._8_4_ = iStack_90 + iStack_a0 + 0x108000 >> auVar11;
  auVar6._4_4_ = iStack_b4 + iStack_c4 + 0x108000 >> auVar12;
  auVar6._0_4_ = local_b8 + local_c8 + 0x108000 >> auVar12;
  auVar6._12_4_ = iStack_ac + iStack_bc + 0x108000 >> auVar12;
  auVar6._8_4_ = iStack_b0 + iStack_c0 + 0x108000 >> auVar12;
  auVar11 = packssdw(auVar7,auVar6);
  *in_RCX = auVar11;
  return;
}

Assistant:

static WEBP_INLINE void ConvertRGBToY_SSE2(const __m128i* const R,
                                           const __m128i* const G,
                                           const __m128i* const B,
                                           __m128i* const Y) {
  const __m128i kRG_y = MK_CST_16(16839, 33059 - 16384);
  const __m128i kGB_y = MK_CST_16(16384, 6420);
  const __m128i kHALF_Y = _mm_set1_epi32((16 << YUV_FIX) + YUV_HALF);

  const __m128i RG_lo = _mm_unpacklo_epi16(*R, *G);
  const __m128i RG_hi = _mm_unpackhi_epi16(*R, *G);
  const __m128i GB_lo = _mm_unpacklo_epi16(*G, *B);
  const __m128i GB_hi = _mm_unpackhi_epi16(*G, *B);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_y, kGB_y, kHALF_Y, YUV_FIX, *Y);
}